

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O2

void tokinclude(tokcxdef *ctx,char *p,int len)

{
  long lVar1;
  size_t sVar2;
  byte bVar3;
  char cVar4;
  undefined2 uVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  linfdef *plVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  linfdef **pplVar14;
  int iVar15;
  errcxdef *ctx_00;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  size_t len_00;
  int iStackY_60;
  tokpdef *local_40;
  char *__s;
  
  if (len == 0) {
    ctx_00 = ctx->tokcxerr;
    iStackY_60 = 0x69;
LAB_0011675e:
    errlogf(ctx_00,"TADS",iStackY_60);
    return;
  }
  local_40 = ctx->tokcxinc;
  bVar3 = *p;
  uVar6 = (uint)bVar3;
  if (bVar3 != 0x22) {
    if (bVar3 != 0x3c) {
      ctx_00 = ctx->tokcxerr;
      iStackY_60 = 0x6a;
      goto LAB_0011675e;
    }
    uVar6 = 0x3e;
    if (local_40 == (tokpdef *)0x0) {
      local_40 = (tokpdef *)0x0;
    }
    else if (local_40->tokpnxt != (tokpdef *)0x0) {
      local_40 = local_40->tokpnxt;
    }
  }
  pcVar11 = p + 1;
  for (uVar12 = 1; len != (int)uVar12; uVar12 = uVar12 + 1) {
    if (uVar6 == (int)p[uVar12]) goto LAB_00116775;
  }
  errlogf(ctx->tokcxerr,"TADS",0x6c);
  uVar12 = (ulong)(uint)len;
LAB_00116775:
  iVar15 = (int)uVar12 + -1;
  sVar2 = uVar12 - 1;
  sVar18 = 0;
  for (; ((uVar16 = 1, len_00 = sVar2, uVar12 != 1 &&
          (uVar16 = uVar12, len_00 = sVar18, p[uVar12 - 1] != '\0')) && (p[uVar12 - 1] != '/'));
      uVar12 = uVar12 - 1) {
    sVar18 = sVar18 + 1;
  }
  pplVar14 = &ctx->tokcxhdr;
  do {
    plVar10 = *pplVar14;
    if (plVar10 == (linfdef *)0x0) {
      plVar10 = linfini(ctx->tokcxmem,ctx->tokcxerr,pcVar11,iVar15,local_40,1,
                        (uint)ctx->tokcxflg >> 5 & 1);
      if (plVar10 == (linfdef *)0x0) {
        pcVar11 = errstr(ctx->tokcxerr,pcVar11,iVar15);
        ctx->tokcxerr->errcxptr->erraav[0].errastr = pcVar11;
        ctx->tokcxerr->errcxptr->erraac = 1;
        errsign(ctx->tokcxerr,0x6b,"TADS");
      }
      (plVar10->linflin).linnxt = &ctx->tokcxhdr->linflin;
      ctx->tokcxhdr = plVar10;
      if (ctx->tokcxdbg != (dbgcxdef *)0x0) {
        ctx->tokcxdbg->dbgcxlin = &plVar10->linflin;
        iVar15 = ctx->tokcxdbg->dbgcxfid;
        ctx->tokcxdbg->dbgcxfid = iVar15 + 1;
        (plVar10->linflin).linid = iVar15;
      }
      uVar5 = ctx->tokcxlin->linflg;
      ctx->tokcxlin->linflg = (uVar5 & 0xffef) + ((ushort)ctx->tokcxflg & 4) * 4;
      (plVar10->linflin).linpar = ctx->tokcxlin;
      ctx->tokcxlin = &plVar10->linflin;
      return;
    }
    sVar8 = strlen(plVar10->linfnam);
    lVar13 = sVar8 + 0x268;
    if (0x267 < lVar13) {
      lVar13 = 0x268;
    }
    lVar9 = sVar8 + 0x269;
    do {
      lVar1 = lVar9 + -1;
      lVar17 = lVar13;
      if ((lVar1 < 0x269) ||
         (cVar4 = *(char *)((long)plVar10 + lVar9 + -2), lVar17 = lVar1, cVar4 == '/')) break;
      lVar9 = lVar1;
    } while (cVar4 != '\0');
    __s = (char *)((long)&(plVar10->linflin).lingetp + lVar17);
    sVar8 = strlen(__s);
    if ((sVar8 == len_00) && (iVar7 = memicmp(__s,p + uVar16,len_00), iVar7 == 0)) {
      pcVar11 = errstr(ctx->tokcxerr,pcVar11,iVar15);
      ctx->tokcxerr->errcxptr->erraav[0].errastr = pcVar11;
      ctx->tokcxerr->errcxptr->erraac = 1;
      errlogn(ctx->tokcxerr,0x6f,"TADS");
      return;
    }
    pplVar14 = (linfdef **)&(plVar10->linflin).linnxt;
  } while( true );
}

Assistant:

static void tokinclude(tokcxdef *ctx, char *p, int len)
{
    linfdef *child;
    tokpdef *path;
    char    *fname;
    int      match;
    int      flen;
    linfdef *lin;
    char    *q;
    size_t   flen2;

    /* find the filename portion */
    fname = p + 1;                            /* remember start of filename */
    path = ctx->tokcxinc;                    /* start with first path entry */

    if (!len)
    {
        errlog(ctx->tokcxerr, ERR_INCNOFN);
        return;
    }
    
    switch(*p)
    {
    case '<':
        match = '>';
        if (path && path->tokpnxt) path = path->tokpnxt;   /* skip 1st path */
        goto find_matching_delim;

    case '"':
        match = '"';

    find_matching_delim:
        for (++p, --len ; len && *p != match ; --len, ++p) ;
        if (len == 0 || *p != match) errlog(ctx->tokcxerr, ERR_INCMTCH);
        break;
        
    default:
        errlog(ctx->tokcxerr, ERR_INCSYN);
        return;
    }
    
    flen = p - fname;                         /* compute length of filename */
    for (q = p, flen2 = 0 ;
         q > fname && *(q-1) != OSPATHCHAR && !strchr(OSPATHALT, *(q-1)) ;
         --q, ++flen2) ;
    
    /* check to see if this file has already been included */
    for (lin = ctx->tokcxhdr ; lin ; lin = (linfdef *)lin->linflin.linnxt)
    {
        char *p = lin->linfnam;
        
        p += strlen(p);
        
        while (p > lin->linfnam && *(p-1) != OSPATHCHAR
               && !strchr(OSPATHALT, *(p-1)))
            --p;
        if (strlen(p) == flen2
            && !memicmp(p, q, flen2))
        {
            errlog1(ctx->tokcxerr, ERR_INCRPT, ERRTSTR,
                    errstr(ctx->tokcxerr, fname, flen));
            return;
        }
    }
    
    /* initialize the line source */
    child = linfini(ctx->tokcxmem, ctx->tokcxerr, fname, flen, path, TRUE,
                    (ctx->tokcxflg & TOKCXFLIN2) != 0);
    
    /* if not found, signal an error */
    if (!child) errsig1(ctx->tokcxerr, ERR_INCSEAR,
                        ERRTSTR, errstr(ctx->tokcxerr, fname, flen));
    
    /* link into tokenizer list of line records */
    child->linflin.linnxt = (lindef *)ctx->tokcxhdr;
    ctx->tokcxhdr = child;

    /* if we're tracking sources for debugging, add into the chain */
    if (ctx->tokcxdbg)
    {
        ctx->tokcxdbg->dbgcxlin = &child->linflin;
        child->linflin.linid = ctx->tokcxdbg->dbgcxfid++;
    }

    /* remember my C-mode setting */
    if (ctx->tokcxflg & TOKCXFCMODE)
        ctx->tokcxlin->linflg |= LINFCMODE;
    else
        ctx->tokcxlin->linflg &= ~LINFCMODE;
    
    child->linflin.linpar = ctx->tokcxlin;   /* remember parent line source */
    ctx->tokcxlin = &child->linflin;   /* make the child the current source */
}